

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

int __thiscall
CVmObjGramProd::getp_get_gram_info
          (CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  long lVar1;
  vm_datatype_t *pvVar2;
  vm_prop_id_t vVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  ulong uVar7;
  vm_prop_id_t *pvVar8;
  CVmObjPageEntry *pCVar9;
  size_t idx;
  size_t sVar10;
  long *plVar11;
  vm_val_t alt_obj_val;
  vm_val_t local_78;
  vm_obj_id_t local_64;
  CVmObjGramProd *local_60;
  vm_obj_id_t local_54;
  vm_val_t *local_50;
  CVmObjPageEntry *local_48;
  size_t local_40;
  CVmObjPageEntry *local_38;
  
  local_60 = this;
  if (getp_get_gram_info(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_gram_info();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_gram_info::desc);
  if (iVar5 == 0) {
    local_50 = retval;
    if (G_interpreter_X.super_CVmStack.max_depth_ <
        ((long)sp_ - (long)G_interpreter_X.super_CVmStack.arr_ >> 4) + 8U) {
      err_throw(0x8ff);
    }
    local_64 = CVmObjList::create(0,*(size_t *)((local_60->super_CVmObject).ext_ + 0x38));
    pCVar9 = G_obj_table_X.pages_[local_64 >> 0xc] + (local_64 & 0xfff);
    uVar7 = (ulong)**(ushort **)((long)&pCVar9->ptr_ + 8);
    if (uVar7 != 0) {
      CVmObjList::cons_clear((CVmObjList *)pCVar9,0,uVar7 - 1);
    }
    pvVar4 = sp_;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar4->val).obj = local_64;
    if (*(long *)((local_60->super_CVmObject).ext_ + 0x38) != 0) {
      plVar11 = *(long **)((local_60->super_CVmObject).ext_ + 0x30);
      sVar10 = 0;
      local_48 = pCVar9;
      do {
        if (G_predef_X.gramprod_gram_alt_info == 0) {
          local_78.typ = VM_NIL;
          CVmObjList::cons_set_element((CVmObjList *)pCVar9,sVar10,&local_78);
        }
        else {
          vVar6 = CVmObjList::create(0,*(size_t *)(*plVar11 + 0x18));
          pCVar9 = G_obj_table_X.pages_[vVar6 >> 0xc] + (vVar6 & 0xfff);
          uVar7 = (ulong)**(ushort **)((long)&pCVar9->ptr_ + 8);
          if (uVar7 != 0) {
            CVmObjList::cons_clear((CVmObjList *)pCVar9,0,uVar7 - 1);
          }
          pvVar4 = sp_;
          pvVar2 = &sp_->typ;
          sp_ = sp_ + 1;
          *pvVar2 = VM_OBJ;
          (pvVar4->val).obj = vVar6;
          local_54 = vVar6;
          local_40 = sVar10;
          if (*(long *)(*plVar11 + 0x18) != 0) {
            pvVar8 = *(vm_prop_id_t **)(*plVar11 + 0x10);
            sVar10 = 0;
            local_38 = pCVar9;
            do {
              pvVar4 = sp_;
              if (G_predef_X.gramprod_gram_alt_tok_info == 0) {
                local_78.typ = VM_NIL;
                goto LAB_0026472e;
              }
              switch((char)pvVar8[1]) {
              case '\x01':
                vVar6 = *(vm_obj_id_t *)(pvVar8 + 4);
                pvVar2 = &sp_->typ;
                sp_ = sp_ + 1;
                *pvVar2 = VM_OBJ;
                goto LAB_00264600;
              case '\x02':
                vVar3 = pvVar8[4];
                pvVar2 = &sp_->typ;
                sp_ = sp_ + 1;
                *pvVar2 = VM_PROP;
                (pvVar4->val).prop = vVar3;
                break;
              case '\x03':
                sp_ = sp_ + 1;
                vVar6 = CVmObjString::create(0,*(char **)(pvVar8 + 4),*(size_t *)(pvVar8 + 8));
                pvVar4->typ = VM_OBJ;
                (pvVar4->val).obj = vVar6;
                break;
              case '\x04':
                vVar6 = *(vm_obj_id_t *)(pvVar8 + 4);
                pvVar2 = &sp_->typ;
                sp_ = sp_ + 1;
                *pvVar2 = VM_ENUM;
LAB_00264600:
                (pvVar4->val).obj = vVar6;
                break;
              case '\x05':
                pvVar2 = &sp_->typ;
                sp_ = sp_ + 1;
                *pvVar2 = VM_NIL;
                break;
              case '\x06':
                vVar6 = CVmObjList::create(0,*(size_t *)(pvVar8 + 4));
                pvVar4 = sp_;
                pCVar9 = G_obj_table_X.pages_[vVar6 >> 0xc];
                pvVar2 = &sp_->typ;
                sp_ = sp_ + 1;
                *pvVar2 = VM_OBJ;
                (pvVar4->val).obj = vVar6;
                if (*(long *)(pvVar8 + 4) != 0) {
                  lVar1 = *(long *)(pvVar8 + 8);
                  idx = 0;
                  do {
                    local_78.typ = VM_PROP;
                    local_78.val.prop = *(unsigned_short *)(lVar1 + idx * 2);
                    CVmObjList::cons_set_element
                              ((CVmObjList *)((long)&pCVar9->ptr_ + (ulong)((vVar6 & 0xfff) * 0x18))
                               ,idx,&local_78);
                    idx = idx + 1;
                  } while (idx < *(ulong *)(pvVar8 + 4));
                }
              }
              pvVar4 = sp_;
              vVar3 = pvVar8[1];
              pvVar2 = &sp_->typ;
              sp_ = sp_ + 1;
              *pvVar2 = VM_INT;
              *(uint *)&pvVar4->val = (uint)(byte)vVar3;
              pvVar4 = sp_;
              if (*pvVar8 == 0) {
                pvVar2 = &sp_->typ;
                sp_ = sp_ + 1;
                *pvVar2 = VM_NIL;
              }
              else {
                vVar3 = *pvVar8;
                pvVar2 = &sp_->typ;
                sp_ = sp_ + 1;
                *pvVar2 = VM_PROP;
                (pvVar4->val).prop = vVar3;
              }
              vVar6 = G_predef_X.gramprod_gram_alt_tok_info;
              pvVar4 = sp_;
              pvVar2 = &sp_->typ;
              sp_ = sp_ + 1;
              *pvVar2 = VM_OBJ;
              (pvVar4->val).obj = vVar6;
              local_78.val.obj = CVmObjTads::create_from_stack_intern((uchar **)0x0,4,0);
              local_78.typ = VM_OBJ;
              pCVar9 = local_38;
LAB_0026472e:
              CVmObjList::cons_set_element((CVmObjList *)pCVar9,sVar10,&local_78);
              sVar10 = sVar10 + 1;
              pvVar8 = pvVar8 + 0x10;
            } while (sVar10 < *(ulong *)(*plVar11 + 0x18));
          }
          pvVar4 = sp_;
          pvVar2 = &sp_->typ;
          sp_ = sp_ + 1;
          *pvVar2 = VM_OBJ;
          (pvVar4->val).obj = local_54;
          pvVar4 = sp_;
          vVar6 = *(vm_obj_id_t *)(*plVar11 + 0xc);
          pvVar2 = &sp_->typ;
          sp_ = sp_ + 1;
          *pvVar2 = VM_OBJ;
          (pvVar4->val).obj = vVar6;
          pvVar4 = sp_;
          vVar6 = *(vm_obj_id_t *)(*plVar11 + 4);
          pvVar2 = &sp_->typ;
          sp_ = sp_ + 1;
          *pvVar2 = VM_INT;
          (pvVar4->val).obj = vVar6;
          pvVar4 = sp_;
          vVar6 = *(vm_obj_id_t *)*plVar11;
          pvVar2 = &sp_->typ;
          sp_ = sp_ + 1;
          *pvVar2 = VM_INT;
          (pvVar4->val).obj = vVar6;
          vVar6 = G_predef_X.gramprod_gram_alt_info;
          pvVar4 = sp_;
          pvVar2 = &sp_->typ;
          sp_ = sp_ + 1;
          *pvVar2 = VM_OBJ;
          (pvVar4->val).obj = vVar6;
          local_78.val.obj = CVmObjTads::create_from_stack_intern((uchar **)0x0,5,0);
          sVar10 = local_40;
          pCVar9 = local_48;
          local_78.typ = VM_OBJ;
          CVmObjList::cons_set_element((CVmObjList *)local_48,local_40,&local_78);
          sp_ = sp_ + -1;
        }
        sVar10 = sVar10 + 1;
        plVar11 = plVar11 + 1;
      } while (sVar10 < *(ulong *)((local_60->super_CVmObject).ext_ + 0x38));
    }
    sp_ = sp_ + -1;
    local_50->typ = VM_OBJ;
    (local_50->val).obj = local_64;
  }
  return 1;
}

Assistant:

int CVmObjGramProd::getp_get_gram_info(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *argc)
{
    vm_obj_id_t alt_lst_id;
    CVmObjList *alt_lst;
    size_t i;
    vmgram_alt_info **altp;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /*
     *   This routine uses considerable extra stack in the course of its
     *   work, so check in advance that we have enough space to run.  
     */
    if (!G_stk->check_space(8))
        err_throw(VMERR_STACK_OVERFLOW);

    /* create a list to hold the rule alternatives */
    alt_lst_id = CVmObjList::create(vmg_ FALSE, get_ext()->alt_cnt_);
    alt_lst = (CVmObjList *)vm_objp(vmg_ alt_lst_id);
    alt_lst->cons_clear();

    /* push it onto the stack for protection from garbage collection */
    G_stk->push()->set_obj(alt_lst_id);

    /* create the rule-alternative descriptions */
    for (i = 0, altp = get_ext()->alts_ ; i < get_ext()->alt_cnt_ ;
         ++i, ++altp)
    {
        size_t j;
        vmgram_tok_info *tokp;
        vm_val_t alt_obj_val;
        vm_obj_id_t tok_lst_id;
        CVmObjList *tok_lst;

        /* 
         *   if our imported GrammarAltInfo class isn't defined, we can't
         *   provide rule-alternative information, so just fill in the list
         *   with a nil 
         */
        if (G_predef->gramprod_gram_alt_info == VM_INVALID_OBJ)
        {
            /* add a nil to the list */
            alt_obj_val.set_nil();
            alt_lst->cons_set_element(i, &alt_obj_val);

            /* done with this slot */
            continue;
        }

        /* create a list to hold the token descriptors */
        tok_lst_id = CVmObjList::create(vmg_ FALSE, (*altp)->tok_cnt);
        tok_lst = (CVmObjList *)vm_objp(vmg_ tok_lst_id);
        tok_lst->cons_clear();

        /* push this momentarily for gc protection */
        G_stk->push()->set_obj(tok_lst_id);

        /*
         *   Run through the tokens in the rule alternative, and build a list
         *   of token descriptor structures. 
         */
        for (j = 0, tokp = (*altp)->toks ; j < (*altp)->tok_cnt ; ++j, ++tokp)
        {
            vm_val_t tok_obj_val;

            /* 
             *   if our imported GrammarAltTokInfo class isn't defined, we
             *   can't provide token information, so just fill in the list
             *   with a nil 
             */
            if (G_predef->gramprod_gram_alt_tok_info == VM_INVALID_OBJ)
            {
                /* add a nil to the list */
                tok_obj_val.set_nil();
                tok_lst->cons_set_element(j, &tok_obj_val);

                /* done with this slot */
                continue;
            }
            
            /* 
             *   The constructor arguments are the target property ID, the
             *   token type code, and extra information that depends on the
             *   type code.  We have to push the arguments backwards per the
             *   normal protocol, so start with the variant part.  
             */
            switch (tokp->typ)
            {
            case VMGRAM_MATCH_PROD:
                /* the extra information is the sub-production object */
                G_stk->push()->set_obj(tokp->typinfo.prod_obj);
                break;

            case VMGRAM_MATCH_SPEECH:
                /* the extra info is the part-of-speech property */
                G_stk->push()->set_propid(tokp->typinfo.speech_prop);
                break;

            case VMGRAM_MATCH_NSPEECH:
                /* the extra info is a list of part-of-speech properties */
                {
                    vm_obj_id_t pos_lst_id;
                    CVmObjList *pos_lst;
                    vm_prop_id_t *pp;
                    size_t k;

                    /* create the property list */
                    pos_lst_id = CVmObjList::create(
                        vmg_ FALSE, tokp->typinfo.nspeech.cnt);
                    pos_lst = (CVmObjList *)vm_objp(vmg_ pos_lst_id);

                    /* push it */
                    G_stk->push()->set_obj(pos_lst_id);

                    /* populate it */
                    for (k = 0, pp = tokp->typinfo.nspeech.props ;
                         k < tokp->typinfo.nspeech.cnt ;
                         ++k, ++pp)
                    {
                        vm_val_t val;
                        
                        /* fill in this element */
                        val.set_propid(*pp);
                        pos_lst->cons_set_element(k, &val);
                    }
                }
                break;

            case VMGRAM_MATCH_LITERAL:
                /* the extra info is the literal string value */
                G_stk->push()->set_obj(CVmObjString::create(
                    vmg_ FALSE, tokp->typinfo.lit.str,
                    tokp->typinfo.lit.len));
                break;

            case VMGRAM_MATCH_TOKTYPE:
                /* the extra information is the token class enum */
                G_stk->push()->set_enum(tokp->typinfo.toktyp_enum);
                break;

            case VMGRAM_MATCH_STAR:
                /* 
                 *   for a 'star' type, there is no extra information, but
                 *   push nil to keep the argument list uniform 
                 */
                G_stk->push()->set_nil();
                break;

            default:
                assert(FALSE);
                break;
            }

            /* now push the target property and type code */
            G_stk->push()->set_int(tokp->typ);
            if (tokp->prop != VM_INVALID_PROP)
                G_stk->push()->set_propid(tokp->prop);
            else
                G_stk->push()->set_nil();

            /* 
             *   the first argument to the constructor is the base class,
             *   which is the imported GrammarAltTokInfo class object 
             */
            G_stk->push()->set_obj(G_predef->gramprod_gram_alt_tok_info);

            /* create the object, at long last */
            tok_obj_val.set_obj(CVmObjTads::create_from_stack(vmg_ 0, 4));

            /* add it to our token list */
            tok_lst->cons_set_element(j, &tok_obj_val);
        }

        /* 
         *   Create the GrammarAltInfo object to desribe the alternative.
         *   Pass in the score, badness, match object, and token list as
         *   arguments to the constructor, which we'll count on to stash the
         *   information away in the new object.
         *   
         *   Note that the first constructor argument is the superclass,
         *   which is the imported GrammarAltInfo class object.  
         */
        G_stk->push()->set_obj(tok_lst_id);
        G_stk->push()->set_obj((*altp)->proc_obj);
        G_stk->push()->set_int((*altp)->badness);
        G_stk->push()->set_int((*altp)->score);
        G_stk->push()->set_obj(G_predef->gramprod_gram_alt_info);
        alt_obj_val.set_obj(CVmObjTads::create_from_stack(vmg_ 0, 5));

        /* add the new GrammarAltInfo to the main alternative list */
        alt_lst->cons_set_element(i, &alt_obj_val);

        /* 
         *   It's safe to discard the gc protection for the token list now,
         *   since a reference to is now stashed away in the GrammarAltInfo
         *   object, which in turn is referenced from our main alternative
         *   list, which we stashed on the stack earlier for gc protection.  
         */
        G_stk->discard();
    }

    /* it's safe to discard our gc protection for the main list now */
    G_stk->discard();

    /* return the main list */
    retval->set_obj(alt_lst_id);

    /* successful evaluation */
    return TRUE;
}